

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O2

VARTYPE __thiscall Node::ScanType(Node *this)

{
  int iVar1;
  VARTYPE VVar2;
  
  iVar1 = this->Type;
  if (iVar1 == 0x110) {
    VVar2 = VARTYPE_BYTE;
  }
  else if (iVar1 == 0x123) {
    VVar2 = VARTYPE_DECIMAL;
  }
  else {
    if (((iVar1 == 300) || (iVar1 == 0x149)) || (iVar1 == 0x14f)) {
      return VARTYPE_DOUBLE;
    }
    if (iVar1 == 0x157) {
      VVar2 = VARTYPE_INTEGER;
    }
    else if (iVar1 == 0x15f) {
      VVar2 = VARTYPE_LONG;
    }
    else if (iVar1 == 0x1ba) {
      VVar2 = VARTYPE_WORD;
    }
    else if (iVar1 == 0x191) {
      VVar2 = VARTYPE_RFA;
    }
    else {
      if (iVar1 != 0x1a0) {
        if (iVar1 != 0x182) {
          return VARTYPE_NONE;
        }
        return RealType;
      }
      VVar2 = VARTYPE_DYNSTR;
    }
  }
  return VVar2;
}

Assistant:

VARTYPE Node::ScanType(void)
{
	//
	// Try to figure out the variable type
	//
	switch (Type)
	{
	case BAS_S_REAL:
		return(RealType);

	case BAS_S_DOUBLE:
		return(VARTYPE_DOUBLE);

	case BAS_S_BYTE:
		return(VARTYPE_BYTE);

	case BAS_S_GFLOAT:
		return(VARTYPE_DOUBLE);

	case BAS_S_HFLOAT:
		return(VARTYPE_DOUBLE);

	case BAS_S_INTEGER:
		return(VARTYPE_INTEGER);

	case BAS_S_LONG:
		return(VARTYPE_LONG);

	case BAS_S_RFA:
		return(VARTYPE_RFA);

	case BAS_S_STRING:
		return(VARTYPE_DYNSTR);

	case BAS_S_WORD:
		return(VARTYPE_WORD);

	case BAS_S_DECIMAL:
		return(VARTYPE_DECIMAL);
	}

	return(VARTYPE_NONE);
}